

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O2

void __thiscall cmCommand::SetError(cmCommand *this,string *e)

{
  string *this_00;
  string asStack_38 [32];
  
  (*(this->super_cmObject)._vptr_cmObject[0xc])(asStack_38,this);
  this_00 = &this->Error;
  std::__cxx11::string::operator=((string *)this_00,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  std::__cxx11::string::append((char *)this_00);
  std::__cxx11::string::append((string *)this_00);
  return;
}

Assistant:

void SetError(const std::string& e)
    {
    this->Error = this->GetName();
    this->Error += " ";
    this->Error += e;
    }